

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseRanges(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  bool bVar2;
  Parsekey PVar3;
  size_t sVar4;
  iterator iVar5;
  HighsInt id;
  size_t *end_00;
  _Alloc_hider _Var6;
  HMpsFF *pHVar7;
  size_type sVar8;
  reference rVar9;
  Parsekey local_158;
  bool skip;
  HighsLogOptions *local_150;
  ulong local_148;
  ulong local_140;
  HighsInt rowidx;
  ulong local_130;
  ulong local_128;
  double local_120;
  HMpsFF *local_118;
  bool is_nan;
  undefined7 uStack_10f;
  string word_1;
  size_t end;
  _Alloc_hider local_c8;
  anon_class_8_1_8991fb9c addRhs;
  string marker;
  size_t begin;
  bool is_nan_1;
  string strline;
  string word;
  
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  pHVar7 = (HMpsFF *)&this->has_row_entry_;
  local_150 = log_options;
  local_c8._M_p = (pointer)pHVar7;
  addRhs.this = this;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar7,(long)this->num_row,false);
  local_118 = (HMpsFF *)&this->rowname2idx;
  local_128 = 0;
  local_130 = 1;
  local_148 = 1;
  local_140 = 0;
  while( true ) {
    do {
      bVar1 = getMpsLine(pHVar7,file,&strline,&skip);
      if (!bVar1) {
        local_158 = kFail;
        goto LAB_002259ac;
      }
    } while (skip != false);
    bVar1 = timeout(this);
    if (bVar1) break;
    word_1._M_string_length = 0;
    word_1.field_2._M_local_buf[0] = '\0';
    end_00 = &end;
    word_1._M_dataplus._M_p = (pointer)&word_1.field_2;
    PVar3 = checkFirstWord(this,&strline,&begin,end_00,&word_1);
    sVar4 = end;
    id = (HighsInt)end_00;
    if (PVar3 == kNone) {
      first_word(&marker,&strline,end);
      sVar4 = first_word_end(&strline,sVar4);
      std::__cxx11::string::assign((char *)&word_1);
      first_word((string *)&is_nan,&strline,sVar4);
      std::__cxx11::string::operator=((string *)&word_1,(string *)&is_nan);
      std::__cxx11::string::~string((string *)&is_nan);
      sVar4 = first_word_end(&strline,sVar4);
      end = sVar4;
      bVar1 = std::operator==(&word_1,"");
      if (bVar1) {
        trim(&marker,&default_non_chars_abi_cxx11_);
        bVar1 = false;
        highsLogUser(local_150,kError,"No range given for row \"%s\"\n",marker._M_dataplus._M_p);
        local_158 = kFail;
      }
      else {
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_118,&marker);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_140 = local_140 + 1;
          if (local_140 % local_148 == 0) {
            _Var6 = marker._M_dataplus;
            highsLogUser(local_150,kWarning,
                         "Row name \"%s\" in RANGES section is not defined: ignored\n");
            id = (HighsInt)_Var6._M_p;
LAB_00225662:
            local_148 = local_148 * 2;
          }
        }
        else {
          pHVar7 = local_118;
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_118,&marker);
          rowidx = *(int *)((long)iVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                  ._M_cur + 0x28);
          sVar8 = (size_type)rowidx;
          if ((long)sVar8 < 0) {
            local_140 = local_140 + 1;
            if (local_140 % local_148 == 0) {
              _Var6 = marker._M_dataplus;
              highsLogUser(local_150,kWarning,
                           "Row name \"%s\" in RANGES section is not valid: ignored\n");
              id = (HighsInt)_Var6._M_p;
              goto LAB_00225662;
            }
          }
          else {
            is_nan = false;
            local_120 = getValue(pHVar7,&word_1,&is_nan,id);
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_c8._M_p,sVar8);
            if ((*rVar9._M_p & rVar9._M_mask) == 0) {
              if (is_nan == true) {
                highsLogUser(local_150,kError,"Range for row \"%s\" is NaN\n",
                             marker._M_dataplus._M_p);
                bVar1 = false;
                local_158 = kFail;
                goto LAB_00225977;
              }
              parseRanges::anon_class_8_1_8991fb9c::operator()(&addRhs,local_120,&rowidx);
            }
            else {
              local_128 = local_128 + 1;
              if (local_128 % local_130 == 0) {
                _Var6 = marker._M_dataplus;
                highsLogUser(local_150,kWarning,
                             "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n",
                             local_120);
                id = (HighsInt)_Var6._M_p;
                local_130 = local_130 * 2;
              }
            }
          }
        }
        bVar2 = is_end(&strline,sVar4,&default_non_chars_abi_cxx11_);
        bVar1 = true;
        if (!bVar2) {
          first_word((string *)&is_nan,&strline,sVar4);
          sVar4 = first_word_end(&strline,sVar4);
          std::__cxx11::string::assign((char *)&word_1);
          first_word((string *)&is_nan_1,&strline,sVar4);
          std::__cxx11::string::operator=((string *)&word_1,(string *)&is_nan_1);
          std::__cxx11::string::~string((string *)&is_nan_1);
          sVar4 = first_word_end(&strline,sVar4);
          end = sVar4;
          bVar1 = std::operator==(&word_1,"");
          if (bVar1) {
            trim((string *)&is_nan,&default_non_chars_abi_cxx11_);
            bVar1 = false;
            highsLogUser(local_150,kError,"No range given for row \"%s\"\n",
                         CONCAT71(uStack_10f,is_nan));
            local_158 = kFail;
          }
          else {
            iVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_118,(key_type *)&is_nan);
            if (iVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_140 = local_140 + 1;
              if (local_140 % local_148 == 0) {
                highsLogUser(local_150,kWarning,
                             "Row name \"%s\" in RANGES section is not defined: ignored\n",
                             CONCAT71(uStack_10f,is_nan));
LAB_002258c8:
                local_148 = local_148 * 2;
              }
            }
            else {
              pHVar7 = local_118;
              iVar5 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_118,(key_type *)&is_nan);
              rowidx = *(int *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                      ._M_cur + 0x28);
              sVar8 = (size_type)rowidx;
              if ((long)sVar8 < 0) {
                local_140 = local_140 + 1;
                if (local_140 % local_148 == 0) {
                  highsLogUser(local_150,kWarning,
                               "Row name \"%s\" in RANGES section is not valid: ignored\n",
                               CONCAT71(uStack_10f,is_nan));
                  goto LAB_002258c8;
                }
              }
              else {
                is_nan_1 = false;
                local_120 = getValue(pHVar7,&word_1,&is_nan_1,id);
                rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)local_c8._M_p,sVar8);
                if ((*rVar9._M_p & rVar9._M_mask) == 0) {
                  if (is_nan_1 == true) {
                    highsLogUser(local_150,kError,"Range for row \"%s\" is NaN\n",
                                 CONCAT71(uStack_10f,is_nan));
                    bVar1 = false;
                    local_158 = kFail;
                    goto LAB_0022596d;
                  }
                  parseRanges::anon_class_8_1_8991fb9c::operator()(&addRhs,local_120,&rowidx);
                }
                else {
                  local_128 = local_128 + 1;
                  if (local_128 % local_130 == 0) {
                    highsLogUser(local_150,kWarning,
                                 "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n"
                                 ,local_120,CONCAT71(uStack_10f,is_nan));
                    local_130 = local_130 * 2;
                  }
                }
              }
            }
            bVar2 = is_end(&strline,sVar4,&default_non_chars_abi_cxx11_);
            bVar1 = true;
            if (!bVar2) {
              trim((string *)&is_nan,&default_non_chars_abi_cxx11_);
              bVar1 = false;
              highsLogUser(local_150,kError,"Unknown specifiers in RANGES section for row \"%s\"\n",
                           CONCAT71(uStack_10f,is_nan));
              local_158 = kFail;
            }
          }
LAB_0022596d:
          std::__cxx11::string::~string((string *)&is_nan);
        }
      }
LAB_00225977:
      std::__cxx11::string::~string((string *)&marker);
    }
    else {
      this->warning_issued_ = local_140 != 0 || local_128 != 0;
      if (local_140 != 0 || local_128 != 0) {
        highsLogUser(local_150,kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d duplicate values\n",
                     local_140,local_128);
      }
      bVar1 = false;
      highsLogDev(local_150,kInfo,"readMPS: Read RANGES  OK\n");
      local_158 = PVar3;
    }
    pHVar7 = (HMpsFF *)&word_1;
    std::__cxx11::string::~string((string *)pHVar7);
    if (!bVar1) {
LAB_002259ac:
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::string::~string((string *)&strline);
      return local_158;
    }
  }
  local_158 = kTimeout;
  goto LAB_002259ac;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRanges(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  auto parseName = [this](const std::string& name, HighsInt& rowidx) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);
  };

  auto addRhs = [this](double val, HighsInt& rowidx) {
    if ((row_type[rowidx] == Boundtype::kEq && val < 0) ||
        row_type[rowidx] == Boundtype::kLe) {
      assert(row_upper.at(rowidx) < kHighsInf);
      row_lower.at(rowidx) = row_upper.at(rowidx) - fabs(val);
    } else if ((row_type[rowidx] == Boundtype::kEq && val > 0) ||
               row_type[rowidx] == Boundtype::kGe) {
      assert(row_lower.at(rowidx) > (-kHighsInf));
      row_upper.at(rowidx) = row_lower.at(rowidx) + fabs(val);
    }
    has_row_entry_[rowidx] = true;
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_range = 0;
  size_t report_ignored_duplicate_range_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_range > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d "
                     "duplicate values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_range));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RANGES  OK\n");
      return key;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No range given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in RANGES section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      parseName(marker, rowidx);
      if (rowidx < 0) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not valid: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        bool is_nan = false;
        double value = getValue(word, is_nan);  // atof(word.c_str());
        if (has_row_entry_[rowidx]) {
          num_ignored_duplicate_range++;
          if (num_ignored_duplicate_range %
                  report_ignored_duplicate_range_frequency ==
              0) {
            highsLogUser(log_options, HighsLogType::kWarning,
                         "Row name \"%s\" in RANGES section has duplicate "
                         "value %g: ignored\n",
                         marker.c_str(), value);
            report_ignored_duplicate_range_frequency *= 2;
          }
        } else {
          if (is_nan) {
            highsLogUser(log_options, HighsLogType::kError,
                         "Range for row \"%s\" is NaN\n", marker.c_str());
            return HMpsFF::Parsekey::kFail;
          }
          addRhs(value, rowidx);
        }
      }
    }

    if (!is_end(strline, end)) {
      std::string marker = first_word(strline, end);
      size_t end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No range given for row \"%s\"\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        parseName(marker, rowidx);
        if (rowidx < 0) {
          num_ignored_row_name++;
          if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
            highsLogUser(
                log_options, HighsLogType::kWarning,
                "Row name \"%s\" in RANGES section is not valid: ignored\n",
                marker.c_str());
            report_ignored_row_name_frequency *= 2;
          }
        } else {
          bool is_nan = false;
          double value = getValue(word, is_nan);  // atof(word.c_str());
          if (has_row_entry_[rowidx]) {
            num_ignored_duplicate_range++;
            if (num_ignored_duplicate_range %
                    report_ignored_duplicate_range_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Row name \"%s\" in RANGES section has duplicate "
                           "value %g: ignored\n",
                           marker.c_str(), value);
              report_ignored_duplicate_range_frequency *= 2;
            }
          } else {
            if (is_nan) {
              highsLogUser(log_options, HighsLogType::kError,
                           "Range for row \"%s\" is NaN\n", marker.c_str());
              return HMpsFF::Parsekey::kFail;
            }
            addRhs(value, rowidx);
          }
        }
      }

      if (!is_end(strline, end)) {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "Unknown specifiers in RANGES section for row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }
  }

  return HMpsFF::Parsekey::kFail;
}